

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_6::ShouldGenerateArraySize
               (EnumDescriptor *descriptor)

{
  int iVar1;
  EnumValueDescriptor *pEVar2;
  undefined4 local_18;
  undefined4 local_14;
  int i;
  int32_t max_value;
  EnumDescriptor *descriptor_local;
  
  pEVar2 = EnumDescriptor::value(descriptor,0);
  local_14 = EnumValueDescriptor::number(pEVar2);
  local_18 = 0;
  while( true ) {
    iVar1 = EnumDescriptor::value_count(descriptor);
    if (iVar1 <= local_18) break;
    pEVar2 = EnumDescriptor::value(descriptor,local_18);
    iVar1 = EnumValueDescriptor::number(pEVar2);
    if (local_14 < iVar1) {
      pEVar2 = EnumDescriptor::value(descriptor,local_18);
      local_14 = EnumValueDescriptor::number(pEVar2);
    }
    local_18 = local_18 + 1;
  }
  iVar1 = std::numeric_limits<int>::max();
  return local_14 != iVar1;
}

Assistant:

bool ShouldGenerateArraySize(const EnumDescriptor* descriptor) {
  int32_t max_value = descriptor->value(0)->number();
  for (int i = 0; i < descriptor->value_count(); i++) {
    if (descriptor->value(i)->number() > max_value) {
      max_value = descriptor->value(i)->number();
    }
  }
  return max_value != std::numeric_limits<int32_t>::max();
}